

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask12_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xc | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[1] = uVar1;
  uVar1 = in[3] << 4 | uVar1;
  out[1] = uVar1;
  uVar1 = in[4] << 0x10 | uVar1;
  out[1] = uVar1;
  uVar2 = in[5];
  out[1] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[2] = uVar2;
  uVar2 = in[6] << 8 | uVar2;
  out[2] = uVar2;
  out[2] = in[7] << 0x14 | uVar2;
  uVar2 = in[8];
  out[3] = uVar2;
  uVar2 = in[9] << 0xc | uVar2;
  out[3] = uVar2;
  uVar1 = in[10];
  out[3] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[4] = uVar1;
  uVar1 = in[0xb] << 4 | uVar1;
  out[4] = uVar1;
  uVar1 = in[0xc] << 0x10 | uVar1;
  out[4] = uVar1;
  uVar2 = in[0xd];
  out[4] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[5] = uVar2;
  uVar2 = in[0xe] << 8 | uVar2;
  out[5] = uVar2;
  out[5] = in[0xf] << 0x14 | uVar2;
  uVar2 = in[0x10];
  out[6] = uVar2;
  uVar2 = in[0x11] << 0xc | uVar2;
  out[6] = uVar2;
  uVar1 = in[0x12];
  out[6] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[7] = uVar1;
  uVar1 = in[0x13] << 4 | uVar1;
  out[7] = uVar1;
  uVar1 = in[0x14] << 0x10 | uVar1;
  out[7] = uVar1;
  uVar2 = in[0x15];
  out[7] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[8] = uVar2;
  uVar2 = in[0x16] << 8 | uVar2;
  out[8] = uVar2;
  out[8] = in[0x17] << 0x14 | uVar2;
  return out + 9;
}

Assistant:

uint32_t *__fastpackwithoutmask12_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (12 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (12 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  ++in;

  return out;
}